

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool SQFunctionProto::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *ret)

{
  bool bVar1;
  undefined1 local_148 [8];
  SQLocalVarInfo lvi;
  undefined1 local_f8 [8];
  SQObjectPtr name_1;
  SQUnsignedInteger type;
  SQObjectPtr proto;
  SQFunctionProto *f;
  undefined1 local_c0 [8];
  SQObjectPtr o;
  undefined1 local_a0 [8];
  SQObjectPtr name;
  SQObjectPtr sourcename;
  SQInteger ndefaultparams;
  SQInteger nfunctions;
  SQInteger ninstructions;
  SQInteger nlineinfos;
  SQInteger nlocalvarinfos;
  SQInteger noutervalues;
  SQInteger nparameters;
  SQInteger nliterals;
  SQInteger i;
  SQObjectPtr *ret_local;
  SQREADFUNC read_local;
  SQUserPointer up_local;
  SQVM *v_local;
  
  i = (SQInteger)ret;
  ret_local = (SQObjectPtr *)read;
  read_local = (SQREADFUNC)up;
  up_local = v;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&name.super_SQObject._unVal);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_a0);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_c0);
  bVar1 = CheckTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,0x50415254);
  if (bVar1) {
    bVar1 = ReadObject((HSQUIRRELVM)up_local,read_local,(SQREADFUNC)ret_local,
                       (SQObjectPtr *)&name.super_SQObject._unVal);
    if (bVar1) {
      bVar1 = ReadObject((HSQUIRRELVM)up_local,read_local,(SQREADFUNC)ret_local,
                         (SQObjectPtr *)local_a0);
      if (bVar1) {
        bVar1 = CheckTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,0x50415254);
        if (bVar1) {
          bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,&nparameters,8);
          if (bVar1) {
            bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,&noutervalues,8
                            );
            if (bVar1) {
              bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,
                               &nlocalvarinfos,8);
              if (bVar1) {
                bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,&nlineinfos
                                 ,8);
                if (bVar1) {
                  bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,
                                   &ninstructions,8);
                  if (bVar1) {
                    bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,
                                     &sourcename.super_SQObject._unVal,8);
                    if (bVar1) {
                      bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,
                                       &nfunctions,8);
                      if (bVar1) {
                        bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,
                                         &ndefaultparams,8);
                        if (bVar1) {
                          proto.super_SQObject._unVal.pFunctionProto =
                               Create(*(SQSharedState **)((long)up_local + 0x118),nfunctions,
                                      nparameters,noutervalues,ndefaultparams,nlocalvarinfos,
                                      ninstructions,nlineinfos,
                                      sourcename.super_SQObject._unVal.nInteger);
                          ::SQObjectPtr::SQObjectPtr
                                    ((SQObjectPtr *)&type,proto.super_SQObject._unVal.pFunctionProto
                                    );
                          ::SQObjectPtr::operator=
                                    (&(proto.super_SQObject._unVal.pGenerator)->_closure,
                                     (SQObjectPtr *)&name.super_SQObject._unVal);
                          ::SQObjectPtr::operator=
                                    (&(proto.super_SQObject._unVal.pOuter)->_value,
                                     (SQObjectPtr *)local_a0);
                          bVar1 = CheckTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local,
                                           0x50415254);
                          if (bVar1) {
                            for (nliterals = 0; nliterals < nparameters; nliterals = nliterals + 1)
                            {
                              bVar1 = ReadObject((HSQUIRRELVM)up_local,read_local,
                                                 (SQREADFUNC)ret_local,(SQObjectPtr *)local_c0);
                              if (!bVar1) {
                                v_local._7_1_ = 0;
                                goto LAB_001bea59;
                              }
                              ::SQObjectPtr::operator=
                                        ((SQObjectPtr *)
                                         (*(long *)&((proto.super_SQObject._unVal.pGenerator)->_ci).
                                                    _ncalls + nliterals * 0x10),
                                         (SQObjectPtr *)local_c0);
                            }
                            bVar1 = CheckTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,read_local
                                             ,0x50415254);
                            if (bVar1) {
                              for (nliterals = 0; nliterals < noutervalues;
                                  nliterals = nliterals + 1) {
                                bVar1 = ReadObject((HSQUIRRELVM)up_local,read_local,
                                                   (SQREADFUNC)ret_local,(SQObjectPtr *)local_c0);
                                if (!bVar1) {
                                  v_local._7_1_ = 0;
                                  goto LAB_001bea59;
                                }
                                ::SQObjectPtr::operator=
                                          ((SQObjectPtr *)
                                           (&(((proto.super_SQObject._unVal.pGenerator)->_etraps).
                                             _vals)->_stackbase + nliterals * 2),
                                           (SQObjectPtr *)local_c0);
                              }
                              bVar1 = CheckTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,
                                               read_local,0x50415254);
                              if (bVar1) {
                                for (nliterals = 0; nliterals < nlocalvarinfos;
                                    nliterals = nliterals + 1) {
                                  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_f8);
                                  bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,
                                                   read_local,&name_1.super_SQObject._unVal,8);
                                  if (bVar1) {
                                    bVar1 = ReadObject((HSQUIRRELVM)up_local,read_local,
                                                       (SQREADFUNC)ret_local,(SQObjectPtr *)local_c0
                                                      );
                                    if (bVar1) {
                                      bVar1 = ReadObject((HSQUIRRELVM)up_local,read_local,
                                                         (SQREADFUNC)ret_local,
                                                         (SQObjectPtr *)local_f8);
                                      if (bVar1) {
                                        SQOuterVar::SQOuterVar
                                                  ((SQOuterVar *)&lvi._pos,(SQObjectPtr *)local_f8,
                                                   (SQObjectPtr *)local_c0,
                                                   (SQOuterType)name_1.super_SQObject._unVal.fFloat)
                                        ;
                                        SQOuterVar::operator=
                                                  ((proto.super_SQObject._unVal.pFunctionProto)->
                                                   _outervalues + nliterals,(SQOuterVar *)&lvi._pos)
                                        ;
                                        SQOuterVar::~SQOuterVar((SQOuterVar *)&lvi._pos);
                                        bVar1 = false;
                                      }
                                      else {
                                        v_local._7_1_ = 0;
                                        bVar1 = true;
                                      }
                                    }
                                    else {
                                      v_local._7_1_ = 0;
                                      bVar1 = true;
                                    }
                                  }
                                  else {
                                    v_local._7_1_ = 0;
                                    bVar1 = true;
                                  }
                                  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_f8);
                                  if (bVar1) goto LAB_001bea59;
                                }
                                bVar1 = CheckTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,
                                                 read_local,0x50415254);
                                if (bVar1) {
                                  for (nliterals = 0; nliterals < nlineinfos;
                                      nliterals = nliterals + 1) {
                                    SQLocalVarInfo::SQLocalVarInfo((SQLocalVarInfo *)local_148);
                                    bVar1 = ReadObject((HSQUIRRELVM)up_local,read_local,
                                                       (SQREADFUNC)ret_local,
                                                       (SQObjectPtr *)local_148);
                                    if (bVar1) {
                                      bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,
                                                       read_local,&lvi._end_op,8);
                                      if (bVar1) {
                                        bVar1 = SafeRead((HSQUIRRELVM)up_local,
                                                         (SQWRITEFUNC)ret_local,read_local,
                                                         &lvi._name.super_SQObject._unVal,8);
                                        if (bVar1) {
                                          bVar1 = SafeRead((HSQUIRRELVM)up_local,
                                                           (SQWRITEFUNC)ret_local,read_local,
                                                           &lvi._start_op,8);
                                          if (bVar1) {
                                            SQLocalVarInfo::operator=
                                                      ((SQLocalVarInfo *)
                                                       ((long)&((((proto.super_SQObject._unVal.
                                                                  pGenerator)->_ci)._closure.
                                                                 super_SQObject._unVal.pTable)->
                                                               super_SQDelegable).
                                                               super_SQCollectable.
                                                               super_SQRefCounted + nliterals * 0x28
                                                       ),(SQLocalVarInfo *)local_148);
                                            bVar1 = false;
                                          }
                                          else {
                                            v_local._7_1_ = 0;
                                            bVar1 = true;
                                          }
                                        }
                                        else {
                                          v_local._7_1_ = 0;
                                          bVar1 = true;
                                        }
                                      }
                                      else {
                                        v_local._7_1_ = 0;
                                        bVar1 = true;
                                      }
                                    }
                                    else {
                                      v_local._7_1_ = 0;
                                      bVar1 = true;
                                    }
                                    SQLocalVarInfo::~SQLocalVarInfo((SQLocalVarInfo *)local_148);
                                    if (bVar1) goto LAB_001bea59;
                                  }
                                  bVar1 = CheckTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,
                                                   read_local,0x50415254);
                                  if (bVar1) {
                                    bVar1 = SafeRead((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,
                                                     read_local,
                                                     *(SQUserPointer *)
                                                      &((proto.super_SQObject._unVal.pGenerator)->
                                                       _ci)._etraps,ninstructions << 4);
                                    if (bVar1) {
                                      bVar1 = CheckTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)ret_local,
                                                       read_local,0x50415254);
                                      if (bVar1) {
                                        bVar1 = SafeRead((HSQUIRRELVM)up_local,
                                                         (SQWRITEFUNC)ret_local,read_local,
                                                         (proto.super_SQObject._unVal.pFunctionProto
                                                         )->_defaultparams,
                                                         sourcename.super_SQObject._unVal.nInteger
                                                         << 3);
                                        if (bVar1) {
                                          bVar1 = CheckTag((HSQUIRRELVM)up_local,
                                                           (SQWRITEFUNC)ret_local,read_local,
                                                           0x50415254);
                                          if (bVar1) {
                                            bVar1 = SafeRead((HSQUIRRELVM)up_local,
                                                             (SQWRITEFUNC)ret_local,read_local,
                                                             (proto.super_SQObject._unVal.
                                                             pFunctionProto)->_instructions,
                                                             nfunctions << 3);
                                            if (bVar1) {
                                              bVar1 = CheckTag((HSQUIRRELVM)up_local,
                                                               (SQWRITEFUNC)ret_local,read_local,
                                                               0x50415254);
                                              if (bVar1) {
                                                for (nliterals = 0; nliterals < ndefaultparams;
                                                    nliterals = nliterals + 1) {
                                                  bVar1 = Load((SQVM *)up_local,read_local,
                                                               (SQREADFUNC)ret_local,
                                                               (SQObjectPtr *)local_c0);
                                                  if (!bVar1) {
                                                    v_local._7_1_ = 0;
                                                    goto LAB_001bea59;
                                                  }
                                                  ::SQObjectPtr::operator=
                                                            ((SQObjectPtr *)
                                                             (((proto.super_SQObject._unVal.
                                                               pGenerator)->_etraps)._allocated +
                                                             nliterals * 0x10),
                                                             (SQObjectPtr *)local_c0);
                                                }
                                                bVar1 = SafeRead((HSQUIRRELVM)up_local,
                                                                 (SQWRITEFUNC)ret_local,read_local,
                                                                 &(proto.super_SQObject._unVal.
                                                                  pTable)->_usednodes,8);
                                                if (bVar1) {
                                                  bVar1 = SafeRead((HSQUIRRELVM)up_local,
                                                                   (SQWRITEFUNC)ret_local,read_local
                                                                   ,&(proto.super_SQObject._unVal.
                                                                     pClosure)->_defaultparams,1);
                                                  if (bVar1) {
                                                    bVar1 = SafeRead((HSQUIRRELVM)up_local,
                                                                     (SQWRITEFUNC)ret_local,
                                                                     read_local,
                                                                     &((proto.super_SQObject._unVal.
                                                                       pGenerator)->_ci)._literals,8
                                                                    );
                                                    if (bVar1) {
                                                      ::SQObjectPtr::operator=
                                                                ((SQObjectPtr *)i,
                                                                 proto.super_SQObject._unVal.
                                                                 pFunctionProto);
                                                      v_local._7_1_ = 1;
                                                    }
                                                    else {
                                                      v_local._7_1_ = 0;
                                                    }
                                                  }
                                                  else {
                                                    v_local._7_1_ = 0;
                                                  }
                                                }
                                                else {
                                                  v_local._7_1_ = 0;
                                                }
                                              }
                                              else {
                                                v_local._7_1_ = 0;
                                              }
                                            }
                                            else {
                                              v_local._7_1_ = 0;
                                            }
                                          }
                                          else {
                                            v_local._7_1_ = 0;
                                          }
                                        }
                                        else {
                                          v_local._7_1_ = 0;
                                        }
                                      }
                                      else {
                                        v_local._7_1_ = 0;
                                      }
                                    }
                                    else {
                                      v_local._7_1_ = 0;
                                    }
                                  }
                                  else {
                                    v_local._7_1_ = 0;
                                  }
                                }
                                else {
                                  v_local._7_1_ = 0;
                                }
                              }
                              else {
                                v_local._7_1_ = 0;
                              }
                            }
                            else {
                              v_local._7_1_ = 0;
                            }
                          }
                          else {
                            v_local._7_1_ = 0;
                          }
LAB_001bea59:
                          ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&type);
                        }
                        else {
                          v_local._7_1_ = 0;
                        }
                      }
                      else {
                        v_local._7_1_ = 0;
                      }
                    }
                    else {
                      v_local._7_1_ = 0;
                    }
                  }
                  else {
                    v_local._7_1_ = 0;
                  }
                }
                else {
                  v_local._7_1_ = 0;
                }
              }
              else {
                v_local._7_1_ = 0;
              }
            }
            else {
              v_local._7_1_ = 0;
            }
          }
          else {
            v_local._7_1_ = 0;
          }
        }
        else {
          v_local._7_1_ = 0;
        }
      }
      else {
        v_local._7_1_ = 0;
      }
    }
    else {
      v_local._7_1_ = 0;
    }
  }
  else {
    v_local._7_1_ = 0;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_c0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_a0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&name.super_SQObject._unVal);
  return (bool)(v_local._7_1_ & 1);
}

Assistant:

bool SQFunctionProto::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &ret)
{
    SQInteger i, nliterals,nparameters;
    SQInteger noutervalues ,nlocalvarinfos ;
    SQInteger nlineinfos,ninstructions ,nfunctions,ndefaultparams ;
    SQObjectPtr sourcename, name;
    SQObjectPtr o;
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(ReadObject(v, up, read, sourcename));
    _CHECK_IO(ReadObject(v, up, read, name));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, &nliterals, sizeof(nliterals)));
    _CHECK_IO(SafeRead(v,read,up, &nparameters, sizeof(nparameters)));
    _CHECK_IO(SafeRead(v,read,up, &noutervalues, sizeof(noutervalues)));
    _CHECK_IO(SafeRead(v,read,up, &nlocalvarinfos, sizeof(nlocalvarinfos)));
    _CHECK_IO(SafeRead(v,read,up, &nlineinfos, sizeof(nlineinfos)));
    _CHECK_IO(SafeRead(v,read,up, &ndefaultparams, sizeof(ndefaultparams)));
    _CHECK_IO(SafeRead(v,read,up, &ninstructions, sizeof(ninstructions)));
    _CHECK_IO(SafeRead(v,read,up, &nfunctions, sizeof(nfunctions)));


    SQFunctionProto *f = SQFunctionProto::Create(_opt_ss(v),ninstructions,nliterals,nparameters,
            nfunctions,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams);
    SQObjectPtr proto = f; //gets a ref in case of failure
    f->_sourcename = sourcename;
    f->_name = name;

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0;i < nliterals; i++){
        _CHECK_IO(ReadObject(v, up, read, o));
        f->_literals[i] = o;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < nparameters; i++){
        _CHECK_IO(ReadObject(v, up, read, o));
        f->_parameters[i] = o;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < noutervalues; i++){
        SQUnsignedInteger type;
        SQObjectPtr name;
        _CHECK_IO(SafeRead(v,read,up, &type, sizeof(SQUnsignedInteger)));
        _CHECK_IO(ReadObject(v, up, read, o));
        _CHECK_IO(ReadObject(v, up, read, name));
        f->_outervalues[i] = SQOuterVar(name,o, (SQOuterType)type);
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));

    for(i = 0; i < nlocalvarinfos; i++){
        SQLocalVarInfo lvi;
        _CHECK_IO(ReadObject(v, up, read, lvi._name));
        _CHECK_IO(SafeRead(v,read,up, &lvi._pos, sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeRead(v,read,up, &lvi._start_op, sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeRead(v,read,up, &lvi._end_op, sizeof(SQUnsignedInteger)));
        f->_localvarinfos[i] = lvi;
    }
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_lineinfos, sizeof(SQLineInfo)*nlineinfos));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_defaultparams, sizeof(SQInteger)*ndefaultparams));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeRead(v,read,up, f->_instructions, sizeof(SQInstruction)*ninstructions));

    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_PART));
    for(i = 0; i < nfunctions; i++){
        _CHECK_IO(_funcproto(o)->Load(v, up, read, o));
        f->_functions[i] = o;
    }
    _CHECK_IO(SafeRead(v,read,up, &f->_stacksize, sizeof(f->_stacksize)));
    _CHECK_IO(SafeRead(v,read,up, &f->_bgenerator, sizeof(f->_bgenerator)));
    _CHECK_IO(SafeRead(v,read,up, &f->_varparams, sizeof(f->_varparams)));

    ret = f;
    return true;
}